

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int64_t client_skip_proxy(archive_read_filter *self,int64_t request)

{
  long in_RSI;
  long *in_RDI;
  int64_t after;
  int64_t before;
  int64_t ask;
  int64_t get;
  int64_t total;
  int64_t skip_limit;
  char *in_stack_ffffffffffffffc8;
  long lVar1;
  undefined8 in_stack_ffffffffffffffd0;
  long local_28;
  long local_18;
  long local_8;
  
  if (in_RSI < 0) {
    __archive_errx((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),in_stack_ffffffffffffffc8);
  }
  if (in_RSI == 0) {
    local_8 = 0;
  }
  else if (*(long *)(in_RDI[3] + 0xd0) == 0) {
    if ((*(long *)(in_RDI[3] + 0xd8) == 0) || (in_RSI < 0x10001)) {
      local_8 = 0;
    }
    else {
      lVar1 = *in_RDI;
      local_8 = (**(code **)(in_RDI[3] + 0xd8))(in_RDI[3],in_RDI[10],in_RSI,1);
      if (local_8 == lVar1 + in_RSI) {
        local_8 = local_8 - lVar1;
      }
      else {
        local_8 = -0x1e;
      }
    }
  }
  else {
    local_28 = 0;
    local_18 = in_RSI;
    while( true ) {
      lVar1 = local_18;
      if (0x40000000 < local_18) {
        lVar1 = 0x40000000;
      }
      lVar1 = (**(code **)(in_RDI[3] + 0xd0))(in_RDI[3],in_RDI[10],lVar1);
      if (lVar1 == 0) break;
      local_18 = local_18 - lVar1;
      local_28 = lVar1 + local_28;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

static int64_t
client_skip_proxy(struct archive_read_filter *self, int64_t request)
{
	if (request < 0)
		__archive_errx(1, "Negative skip requested.");
	if (request == 0)
		return 0;

	if (self->archive->client.skipper != NULL) {
		/* Seek requests over 1GiB are broken down into
		 * multiple seeks.  This avoids overflows when the
		 * requests get passed through 32-bit arguments. */
		int64_t skip_limit = (int64_t)1 << 30;
		int64_t total = 0;
		for (;;) {
			int64_t get, ask = request;
			if (ask > skip_limit)
				ask = skip_limit;
			get = (self->archive->client.skipper)
				(&self->archive->archive, self->data, ask);
			if (get == 0)
				return (total);
			request -= get;
			total += get;
		}
	} else if (self->archive->client.seeker != NULL
		&& request > 64 * 1024) {
		/* If the client provided a seeker but not a skipper,
		 * we can use the seeker to skip forward.
		 *
		 * Note: This isn't always a good idea.  The client
		 * skipper is allowed to skip by less than requested
		 * if it needs to maintain block alignment.  The
		 * seeker is not allowed to play such games, so using
		 * the seeker here may be a performance loss compared
		 * to just reading and discarding.  That's why we
		 * only do this for skips of over 64k.
		 */
		int64_t before = self->position;
		int64_t after = (self->archive->client.seeker)
		    (&self->archive->archive, self->data, request, SEEK_CUR);
		if (after != before + request)
			return ARCHIVE_FATAL;
		return after - before;
	}
	return 0;
}